

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O3

int gpioSetWatchdog(uint gpio,uint timeout)

{
  ulong uVar1;
  FILE *pFVar2;
  uint uVar3;
  int iVar4;
  
  pFVar2 = _stderr;
  uVar1 = (ulong)gpio;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(pFVar2,"%s %s: gpio=%d timeout=%d\n",myTimeStamp::buf,"gpioSetWatchdog",uVar1,timeout);
  }
  pFVar2 = _stderr;
  if (libInitialised == '\0') {
    iVar4 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioSetWatchdog_cold_1();
    }
  }
  else if (gpio < 0x20) {
    if (timeout < 0xea61) {
      gpioAlert[uVar1].wdTick = systReg[1];
      gpioAlert[uVar1].wdSteadyUs = timeout * 1000;
      uVar3 = 1 << ((byte)gpio & 0x1f);
      if (timeout == 0) {
        wdogBits = wdogBits & ~uVar3;
      }
      else {
        wdogBits = wdogBits | uVar3;
      }
      iVar4 = 0;
    }
    else {
      iVar4 = -0xf;
      if ((gpioCfg.internals >> 10 & 1) == 0) {
        myTimeStamp();
        fprintf(pFVar2,"%s %s: gpio %d, bad timeout (%d)\n",myTimeStamp::buf,"gpioSetWatchdog",uVar1
                ,timeout);
      }
    }
  }
  else {
    iVar4 = -2;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioSetWatchdog_cold_2();
    }
  }
  return iVar4;
}

Assistant:

int gpioSetWatchdog(unsigned gpio, unsigned timeout)
{
   DBG(DBG_USER, "gpio=%d timeout=%d", gpio, timeout);

   CHECK_INITED;

   if (gpio > PI_MAX_USER_GPIO)
      SOFT_ERROR(PI_BAD_USER_GPIO, "bad gpio (%d)", gpio);

   if (timeout > PI_MAX_WDOG_TIMEOUT)
      SOFT_ERROR(PI_BAD_WDOG_TIMEOUT,
         "gpio %d, bad timeout (%d)", gpio, timeout);

   gpioAlert[gpio].wdTick   = systReg[SYST_CLO];
   gpioAlert[gpio].wdSteadyUs = timeout*1000;

   if (timeout) wdogBits |= (1<<gpio);
   else         wdogBits &= (~(1<<gpio));

   return 0;
}